

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

void __thiscall
glcts::TestCaseBase::shaderSourceSpecialized
          (TestCaseBase *this,GLuint shader_id,GLsizei shader_count,GLchar **shader_string)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined8 local_50;
  char *specialized_cstr;
  string specialized;
  Functions *gl;
  GLchar **shader_string_local;
  GLsizei shader_count_local;
  GLuint shader_id_local;
  TestCaseBase *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  specialized.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  specializeShader_abi_cxx11_((string *)&specialized_cstr,this,shader_count,shader_string);
  local_50 = std::__cxx11::string::c_str();
  (**(code **)(specialized.field_2._8_8_ + 0x12b8))(shader_id,1,&local_50,0);
  std::__cxx11::string::~string((string *)&specialized_cstr);
  return;
}

Assistant:

void TestCaseBase::shaderSourceSpecialized(glw::GLuint shader_id, glw::GLsizei shader_count,
										   const glw::GLchar* const* shader_string)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::string specialized		 = specializeShader(shader_count, shader_string);
	const char* specialized_cstr = specialized.c_str();
	gl.shaderSource(shader_id, 1, &specialized_cstr, NULL);
}